

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O3

void __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::show_stats
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this,ostream *os,int n)

{
  uint64_t uVar1;
  ostream *poVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 in_XMM2 [16];
  string indent;
  char local_51;
  long *local_50;
  long local_48;
  long local_40 [2];
  double local_30;
  undefined1 extraout_var [56];
  
  local_50 = local_40;
  auVar4._0_8_ = std::__cxx11::string::_M_construct((ulong)&local_50,(char)(n << 2));
  auVar4._8_56_ = extraout_var;
  auVar3 = auVar4._0_16_;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"name",4);
  local_51 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"standard_hash_table",0x13);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  auVar3 = vcvtusi2sd_avx512f(auVar3,this->size_);
  uVar1 = (this->capa_size_).mask_;
  local_30 = auVar3._0_8_;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"factor",6);
  local_51 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  auVar3 = vcvtusi2sd_avx512f(in_XMM2,uVar1 + 1);
  poVar2 = std::ostream::_M_insert<double>((local_30 / auVar3._0_8_) * 100.0);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"max_factor",10);
  local_51 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"size",4);
  local_51 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"capa_size",9);
  local_51 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"alloc_bytes",0xb);
  local_51 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "standard_hash_table");
        show_stat(os, indent, "factor", double(size()) / capa_size() * 100);
        show_stat(os, indent, "max_factor", MaxFactor);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "capa_size", capa_size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "num_resize", num_resize_);
#endif
    }